

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseStartModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  StartModuleField *pSVar2;
  Enum EVar3;
  Location loc;
  Var var;
  _Head_base<0UL,_wabt::StartModuleField_*,_false> local_e0;
  size_t local_d8;
  char *pcStack_d0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_c8;
  undefined8 uStack_c0;
  Var local_b8;
  Var local_70;
  
  RVar1 = Expect(this,Lpar);
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    GetToken((Token *)&local_70,this);
    local_c8.offset = (size_t)local_70.loc.field_1.field_1.offset;
    uStack_c0 = local_70.loc.field_1._8_8_;
    local_d8 = local_70.loc.filename._M_len;
    pcStack_d0 = local_70.loc.filename._M_str;
    if ((module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      RVar1 = Expect(this,Start);
      EVar3 = Error;
      if (RVar1.enum_ != Error) {
        Var::Var(&local_b8);
        RVar1 = ParseVar(this,&local_b8);
        EVar3 = Error;
        if (RVar1.enum_ != Error) {
          RVar1 = Expect(this,Rpar);
          if (RVar1.enum_ != Error) {
            pSVar2 = (StartModuleField *)operator_new(0x88);
            Var::Var(&local_70,&local_b8);
            (pSVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.
            super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
            (pSVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.
            super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
            (pSVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.
            _vptr_ModuleField = (_func_int **)&PTR__ModuleField_001d1cc0;
            (pSVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.loc.
            filename._M_len = local_d8;
            (pSVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.loc.
            filename._M_str = pcStack_d0;
            (pSVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.loc.field_1
            .field_1.offset = local_c8.offset;
            *(undefined8 *)
             ((long)&(pSVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.
                     loc.field_1 + 8) = uStack_c0;
            (pSVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.type_ =
                 Start;
            (pSVar2->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.
            _vptr_ModuleField = (_func_int **)&PTR__StartModuleField_001d2880;
            Var::Var(&pSVar2->start,&local_70);
            local_e0._M_head_impl = pSVar2;
            Var::~Var(&local_70);
            Module::AppendField(module,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                                        *)&local_e0);
            if (local_e0._M_head_impl != (StartModuleField *)0x0) {
              (*((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_e0._M_head_impl = (StartModuleField *)0x0;
            EVar3 = Ok;
          }
        }
        Var::~Var(&local_b8);
      }
    }
    else {
      Error(this,0x199ffb);
      EVar3 = Error;
    }
  }
  return (Result)EVar3;
}

Assistant:

Result WastParser::ParseStartModuleField(Module* module) {
  WABT_TRACE(ParseStartModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  if (module->starts.size() > 0) {
    Error(loc, "multiple start sections");
    return Result::Error;
  }
  EXPECT(Start);
  Var var;
  CHECK_RESULT(ParseVar(&var));
  EXPECT(Rpar);
  module->AppendField(std::make_unique<StartModuleField>(var, loc));
  return Result::Ok;
}